

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O3

void __thiscall
Assimp::PLYImporter::LoadMaterial
          (PLYImporter *this,vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvOut,
          string *defaultTexture,bool pointsOnly)

{
  pointer pEVar1;
  pointer pPVar2;
  pointer pPVar3;
  double dVar4;
  iterator iVar5;
  undefined1 auVar6 [16];
  long *plVar7;
  DOM *pDVar8;
  aiMaterial *paVar9;
  runtime_error *prVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  char *pKey;
  pointer pEVar12;
  ulong uVar13;
  uint uVar14;
  size_t sVar15;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *pvVar16;
  EDataType EVar17;
  uint uVar18;
  pointer pPVar19;
  uint uVar20;
  pointer avList;
  float fVar21;
  aiMaterial *pcHelper;
  int iMode;
  int two_sided_1;
  aiColor4D clrOut;
  int two_sided;
  aiMaterial *local_540;
  EDataType local_538;
  uint local_534;
  EDataType local_530;
  EDataType local_52c;
  undefined4 local_528;
  undefined4 local_524;
  allocator<char> local_51d;
  EDataType local_51c;
  uint local_518;
  EDataType local_514;
  uint local_510;
  EDataType local_50c;
  EDataType local_508;
  uint local_504;
  EDataType local_500;
  uint local_4fc;
  EDataType local_4f8;
  EDataType local_4f4;
  uint local_4f0;
  EDataType local_4ec;
  uint local_4e8;
  EDataType local_4e4;
  EDataType local_4e0;
  undefined4 local_4dc;
  pointer local_4d8;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_4d0;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [8];
  undefined8 uStack_4b0;
  undefined1 local_4a8 [8];
  undefined8 uStack_4a0;
  uint local_498;
  undefined4 uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint local_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  uint local_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  long *local_468;
  ulong local_460;
  long local_458 [2];
  aiColor4D local_448;
  aiString local_438;
  
  local_528 = (undefined4)CONCAT71(in_register_00000009,pointsOnly);
  local_4d0 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)pvOut;
  if (pvOut == (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)0x0) {
    __assert_fail("__null != pvOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyLoader.cpp"
                  ,0x2d5,
                  "void Assimp::PLYImporter::LoadMaterial(std::vector<aiMaterial *> *, std::string &, const bool)"
                 );
  }
  local_478 = 0xffffffff;
  uStack_474 = 0xffffffff;
  uStack_470 = 0xffffffff;
  uStack_46c = 0xffffffff;
  local_488 = 0xffffffff;
  uStack_484 = 0xffffffff;
  uStack_480 = 0xffffffff;
  uStack_47c = 0xffffffff;
  local_498 = 0xffffffff;
  uStack_494 = 0xffffffff;
  uStack_490 = 0xffffffff;
  uStack_48c = 0xffffffff;
  _local_4a8 = (undefined1  [16])0x0;
  _local_4b8 = (undefined1  [16])0x0;
  local_4c8 = (undefined1  [16])0x0;
  pDVar8 = this->pcDOM;
  pEVar12 = (pDVar8->alElements).
            super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pEVar12 !=
      (pDVar8->alElements).
      super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar14 = 0;
    do {
      if (pEVar12->eSemantic == EEST_TextureFile) {
        std::__cxx11::string::_M_assign((string *)defaultTexture);
        pDVar8 = this->pcDOM;
      }
      else if (pEVar12->eSemantic == EEST_Material) {
        pEVar1 = (pDVar8->alElementData).
                 super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar19 = (pEVar12->alProperties).
                  super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar2 = (pEVar12->alProperties).
                 super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pPVar19 == pPVar2) {
          local_538 = CONCAT31(local_538._1_3_,1);
          local_498 = 0xffffffff;
          EVar17 = EDT_Char;
          local_530 = EDT_Char;
          local_52c = EDT_Char;
          local_534 = 0xffffffff;
        }
        else {
          local_4d8 = (pointer)CONCAT44(local_4d8._4_4_,0xffffffff);
          local_538 = EDT_Char;
          local_4e0 = EDT_Char;
          local_4e8 = 0xffffffff;
          local_4e4 = EDT_Char;
          local_4f0 = 0xffffffff;
          local_4ec = EDT_Char;
          local_4fc = 0xffffffff;
          local_4f4 = EDT_Char;
          local_504 = 0xffffffff;
          local_4f8 = EDT_Char;
          local_510 = 0xffffffff;
          local_500 = EDT_Char;
          local_518 = 0xffffffff;
          local_508 = EDT_Char;
          local_478 = 0xffffffff;
          local_50c = EDT_Char;
          uStack_474 = 0xffffffff;
          local_514 = EDT_Char;
          uStack_470 = 0xffffffff;
          local_51c = EDT_Char;
          uStack_46c = 0xffffffff;
          local_534 = 0xffffffff;
          uVar20 = 0;
          local_52c = EDT_Char;
          uVar18 = 0xffffffff;
          local_530 = EDT_Char;
          local_498 = 0xffffffff;
          EVar17 = EDT_Char;
          do {
            if (pPVar19->bIsList == false) {
              switch(pPVar19->Semantic) {
              case EST_AmbientRed:
                local_508 = pPVar19->eType;
                local_478 = uVar20;
                break;
              case EST_AmbientGreen:
                local_50c = pPVar19->eType;
                uStack_474 = uVar20;
                break;
              case EST_AmbientBlue:
                local_514 = pPVar19->eType;
                uStack_470 = uVar20;
                break;
              case EST_AmbientAlpha:
                local_51c = pPVar19->eType;
                uStack_46c = uVar20;
                break;
              case EST_DiffuseRed:
                EVar17 = pPVar19->eType;
                local_498 = uVar20;
                break;
              case EST_DiffuseGreen:
                local_538 = pPVar19->eType;
                local_4d8 = (pointer)CONCAT44(local_4d8._4_4_,uVar20);
                break;
              case EST_DiffuseBlue:
                local_4e0 = pPVar19->eType;
                local_4e8 = uVar20;
                break;
              case EST_DiffuseAlpha:
                local_4e4 = pPVar19->eType;
                local_4f0 = uVar20;
                break;
              case EST_SpecularRed:
                local_4ec = pPVar19->eType;
                local_4fc = uVar20;
                break;
              case EST_SpecularGreen:
                local_4f4 = pPVar19->eType;
                local_504 = uVar20;
                break;
              case EST_SpecularBlue:
                local_4f8 = pPVar19->eType;
                local_510 = uVar20;
                break;
              case EST_SpecularAlpha:
                local_500 = pPVar19->eType;
                local_518 = uVar20;
                break;
              case EST_PhongPower:
                local_530 = pPVar19->eType;
                local_534 = uVar20;
                break;
              case EST_Opacity:
                local_52c = pPVar19->eType;
                uVar18 = uVar20;
              }
            }
            pPVar19 = pPVar19 + 1;
            uVar20 = uVar20 + 1;
          } while (pPVar19 != pPVar2);
          uStack_4a0._0_4_ = local_514;
          uStack_4a0._4_4_ = local_51c;
          local_4a8._4_4_ = local_50c;
          local_4a8._0_4_ = local_508;
          uStack_47c = local_518;
          uStack_480 = local_510;
          uStack_4b0._0_4_ = local_4f8;
          uStack_4b0._4_4_ = local_500;
          uStack_484 = local_504;
          local_4b8._4_4_ = local_4f4;
          local_488 = local_4fc;
          local_4b8._0_4_ = local_4ec;
          uStack_48c = local_4f0;
          uStack_490 = local_4e8;
          local_4c8._8_4_ = local_4e0;
          local_4c8._12_4_ = local_4e4;
          uStack_494 = local_4d8._0_4_;
          auVar6._4_8_ = local_4c8._8_8_;
          auVar6._0_4_ = local_538;
          auVar6._12_4_ = 0;
          local_4c8 = auVar6 << 0x20;
          local_538 = CONCAT31(local_538._1_3_,uVar18 == 0xffffffff);
        }
        local_4c8._0_4_ = EVar17;
        if (pEVar1 != (pointer)0x0) {
          local_4d8 = pEVar1 + uVar14;
          avList = *(pointer *)
                    &(local_4d8->alInstances).
                     super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                     ._M_impl;
          if (avList == *(pointer *)
                         ((long)&(local_4d8->alInstances).
                                 super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                                 ._M_impl + 8)) {
            return;
          }
          uVar13 = (ulong)(int)local_534;
          pvVar16 = local_4d0;
          do {
            local_448.r = 0.0;
            local_448.g = 0.0;
            local_448.b = 0.0;
            local_448.a = 0.0;
            paVar9 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(paVar9);
            local_540 = paVar9;
            GetMaterialColor(&avList->alProperties,&local_498,(EDataType *)local_4c8,&local_448);
            aiMaterial::AddBinaryProperty(local_540,&local_448,0x10,"$clr.diffuse",0,0,aiPTI_Float);
            GetMaterialColor(&avList->alProperties,&local_488,(EDataType *)local_4b8,&local_448);
            aiMaterial::AddBinaryProperty(local_540,&local_448,0x10,"$clr.specular",0,0,aiPTI_Float)
            ;
            GetMaterialColor(&avList->alProperties,&local_478,(EDataType *)local_4a8,&local_448);
            aiMaterial::AddBinaryProperty(local_540,&local_448,0x10,"$clr.ambient",0,0,aiPTI_Float);
            local_524 = 2;
            if (local_534 != 0xffffffff) {
              pPVar3 = (avList->alProperties).
                       super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar11 = ((long)(avList->alProperties).
                              super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
                       -0x5555555555555555;
              if (uVar11 < uVar13 || uVar11 - uVar13 == 0) {
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_438._0_8_ = local_438.data + 0xc;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_438,"Invalid .ply file: Property index is out of range."
                           ,"");
                std::runtime_error::runtime_error(prVar10,(string *)&local_438);
                *(undefined ***)prVar10 = &PTR__runtime_error_0080bf48;
                __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (local_530 < EDT_INVALID) {
                dVar4 = **(double **)
                          &pPVar3[uVar13].avList.
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                ;
                fVar21 = SUB84(dVar4,0);
                switch(local_530) {
                default:
                  fVar21 = (float)(int)fVar21;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar21 = (float)((ulong)dVar4 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar21 = (float)dVar4;
                }
                if ((fVar21 != 0.0) || (NAN(fVar21))) {
                  local_438.length = (ai_uint32)(fVar21 * 15.0);
                  aiMaterial::AddBinaryProperty
                            (local_540,&local_438,4,"$mat.shininess",0,0,aiPTI_Float);
                  local_524 = 3;
                }
              }
            }
            aiMaterial::AddBinaryProperty(local_540,&local_524,4,"$mat.shadingm",0,0,aiPTI_Integer);
            if ((undefined1)local_538 == '\0') {
              pPVar3 = (avList->alProperties).
                       super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar11 = ((long)(avList->alProperties).
                              super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
                       -0x5555555555555555;
              if (uVar11 < uVar13 || uVar11 - uVar13 == 0) {
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_438._0_8_ = local_438.data + 0xc;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_438,"Invalid .ply file: Property index is out of range."
                           ,"");
                std::runtime_error::runtime_error(prVar10,(string *)&local_438);
                *(undefined ***)prVar10 = &PTR__runtime_error_0080bf48;
                __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (local_52c < EDT_INVALID) {
                dVar4 = **(double **)
                          &pPVar3[uVar13].avList.
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                ;
                fVar21 = SUB84(dVar4,0);
                switch(local_52c) {
                default:
                  fVar21 = (float)(int)fVar21;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar21 = (float)((ulong)dVar4 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar21 = (float)dVar4;
                }
              }
              else {
                fVar21 = 0.0;
              }
              local_438.length = (ai_uint32)fVar21;
              aiMaterial::AddBinaryProperty(local_540,&local_438,4,"$mat.opacity",0,0,aiPTI_Float);
            }
            local_4dc = 1;
            aiMaterial::AddBinaryProperty(local_540,&local_4dc,4,"$mat.twosided",0,0,aiPTI_Integer);
            if (defaultTexture->_M_string_length != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_468,(defaultTexture->_M_dataplus)._M_p,&local_51d);
              plVar7 = local_468;
              sVar15 = local_460 & 0xffffffff;
              if ((local_460 & 0xfffffc00) != 0) {
                sVar15 = 0x3ff;
              }
              local_438.length = (ai_uint32)sVar15;
              memcpy((void *)((long)&local_438 + 4),local_468,sVar15);
              *(undefined1 *)((long)&local_438 + sVar15 + 4) = 0;
              if (plVar7 != local_458) {
                operator_delete(plVar7,local_458[0] + 1);
              }
              aiMaterial::AddProperty(local_540,&local_438,"$tex.file",1,0);
              pvVar16 = local_4d0;
            }
            if ((char)local_528 == '\0') {
              pKey = "$mat.twosided";
            }
            else {
              pKey = "$mat.wireframe";
            }
            local_438.length = 1;
            aiMaterial::AddBinaryProperty(local_540,&local_438,4,pKey,0,0,aiPTI_Integer);
            iVar5._M_current = *(aiMaterial ***)(pvVar16 + 8);
            if (iVar5._M_current == *(aiMaterial ***)(pvVar16 + 0x10)) {
              std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
              _M_realloc_insert<aiMaterial*const&>(pvVar16,iVar5,&local_540);
            }
            else {
              *iVar5._M_current = local_540;
              *(long *)(pvVar16 + 8) = *(long *)(pvVar16 + 8) + 8;
            }
            avList = avList + 1;
          } while (avList != *(pointer *)
                              ((long)&(local_4d8->alInstances).
                                      super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                                      ._M_impl + 8));
          return;
        }
        break;
      }
      pEVar12 = pEVar12 + 1;
      uVar14 = uVar14 + 1;
    } while (pEVar12 !=
             (pDVar8->alElements).
             super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  paVar9 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar9);
  local_524 = 2;
  local_540 = paVar9;
  aiMaterial::AddBinaryProperty(paVar9,&local_524,4,"$mat.shadingm",0,0,aiPTI_Integer);
  local_448.b = 1.0;
  local_448._0_8_ = 0x3f8000003f800000;
  aiMaterial::AddBinaryProperty(paVar9,&local_448,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(paVar9,&local_448,0xc,"$clr.specular",0,0,aiPTI_Float);
  local_448.b = 1.0;
  local_448.r = 1.0;
  local_448.g = 1.0;
  aiMaterial::AddBinaryProperty(paVar9,&local_448,0xc,"$clr.ambient",0,0,aiPTI_Float);
  if ((char)local_528 == '\0') {
    local_438.length = 1;
    aiMaterial::AddBinaryProperty(paVar9,&local_438,4,"$mat.twosided",0,0,aiPTI_Integer);
  }
  pvVar16 = local_4d0;
  if (defaultTexture->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,(defaultTexture->_M_dataplus)._M_p,(allocator<char> *)&local_4dc
              );
    sVar15 = 0x3ff;
    if ((local_460 & 0xfffffc00) == 0) {
      sVar15 = local_460 & 0xffffffff;
    }
    local_438.length = (ai_uint32)sVar15;
    memcpy((void *)((long)&local_438 + 4),local_468,sVar15);
    *(undefined1 *)((long)&local_438 + sVar15 + 4) = 0;
    if (local_468 != local_458) {
      operator_delete(local_468,local_458[0] + 1);
    }
    aiMaterial::AddProperty(paVar9,&local_438,"$tex.file",1,0);
  }
  if ((char)local_528 != '\0') {
    local_438.length = 1;
    aiMaterial::AddBinaryProperty(paVar9,&local_438,4,"$mat.wireframe",0,0,aiPTI_Integer);
  }
  iVar5._M_current = *(aiMaterial ***)(pvVar16 + 8);
  if (iVar5._M_current == *(aiMaterial ***)(pvVar16 + 0x10)) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              (pvVar16,iVar5,&local_540);
  }
  else {
    *iVar5._M_current = paVar9;
    *(long *)(pvVar16 + 8) = *(long *)(pvVar16 + 8) + 8;
  }
  return;
}

Assistant:

void PLYImporter::LoadMaterial(std::vector<aiMaterial*>* pvOut, std::string &defaultTexture, const bool pointsOnly)
{
  ai_assert(NULL != pvOut);

  // diffuse[4], specular[4], ambient[4]
  // rgba order
  unsigned int aaiPositions[3][4] = {

    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
  };

  PLY::EDataType aaiTypes[3][4] = {
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char }
  };
  PLY::ElementInstanceList* pcList = NULL;

  unsigned int iPhong = 0xFFFFFFFF;
  PLY::EDataType ePhong = EDT_Char;

  unsigned int iOpacity = 0xFFFFFFFF;
  PLY::EDataType eOpacity = EDT_Char;

  // search in the DOM for a vertex entry
  unsigned int _i = 0;
  for (std::vector<PLY::Element>::const_iterator i = this->pcDOM->alElements.begin();
    i != this->pcDOM->alElements.end(); ++i, ++_i)
  {
    if (PLY::EEST_Material == (*i).eSemantic)
    {
      pcList = &this->pcDOM->alElementData[_i];

      // now check whether which coordinate sets are available
      unsigned int _a = 0;
      for (std::vector<PLY::Property>::const_iterator
        a = (*i).alProperties.begin();
        a != (*i).alProperties.end(); ++a, ++_a)
      {
        if ((*a).bIsList)continue;

        // pohng specularity      -----------------------------------
        if (PLY::EST_PhongPower == (*a).Semantic)
        {
          iPhong = _a;
          ePhong = (*a).eType;
        }

        // general opacity        -----------------------------------
        if (PLY::EST_Opacity == (*a).Semantic)
        {
          iOpacity = _a;
          eOpacity = (*a).eType;
        }

        // diffuse color channels -----------------------------------
        if (PLY::EST_DiffuseRed == (*a).Semantic)
        {
          aaiPositions[0][0] = _a;
          aaiTypes[0][0] = (*a).eType;
        }
        else if (PLY::EST_DiffuseGreen == (*a).Semantic)
        {
          aaiPositions[0][1] = _a;
          aaiTypes[0][1] = (*a).eType;
        }
        else if (PLY::EST_DiffuseBlue == (*a).Semantic)
        {
          aaiPositions[0][2] = _a;
          aaiTypes[0][2] = (*a).eType;
        }
        else if (PLY::EST_DiffuseAlpha == (*a).Semantic)
        {
          aaiPositions[0][3] = _a;
          aaiTypes[0][3] = (*a).eType;
        }
        // specular color channels -----------------------------------
        else if (PLY::EST_SpecularRed == (*a).Semantic)
        {
          aaiPositions[1][0] = _a;
          aaiTypes[1][0] = (*a).eType;
        }
        else if (PLY::EST_SpecularGreen == (*a).Semantic)
        {
          aaiPositions[1][1] = _a;
          aaiTypes[1][1] = (*a).eType;
        }
        else if (PLY::EST_SpecularBlue == (*a).Semantic)
        {
          aaiPositions[1][2] = _a;
          aaiTypes[1][2] = (*a).eType;
        }
        else if (PLY::EST_SpecularAlpha == (*a).Semantic)
        {
          aaiPositions[1][3] = _a;
          aaiTypes[1][3] = (*a).eType;
        }
        // ambient color channels -----------------------------------
        else if (PLY::EST_AmbientRed == (*a).Semantic)
        {
          aaiPositions[2][0] = _a;
          aaiTypes[2][0] = (*a).eType;
        }
        else if (PLY::EST_AmbientGreen == (*a).Semantic)
        {
          aaiPositions[2][1] = _a;
          aaiTypes[2][1] = (*a).eType;
        }
        else if (PLY::EST_AmbientBlue == (*a).Semantic)
        {
          aaiPositions[2][2] = _a;
          aaiTypes[2][2] = (*a).eType;
        }
        else if (PLY::EST_AmbientAlpha == (*a).Semantic)
        {
          aaiPositions[2][3] = _a;
          aaiTypes[2][3] = (*a).eType;
        }
      }
      break;
    }
    else if (PLY::EEST_TextureFile == (*i).eSemantic)
    {
      defaultTexture = (*i).szName;
    }
  }
  // check whether we have a valid source for the material data
  if (NULL != pcList) {
    for (std::vector<ElementInstance>::const_iterator i = pcList->alInstances.begin(); i != pcList->alInstances.end(); ++i)  {
      aiColor4D clrOut;
      aiMaterial* pcHelper = new aiMaterial();

      // build the diffuse material color
      GetMaterialColor((*i).alProperties, aaiPositions[0], aaiTypes[0], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_DIFFUSE);

      // build the specular material color
      GetMaterialColor((*i).alProperties, aaiPositions[1], aaiTypes[1], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_SPECULAR);

      // build the ambient material color
      GetMaterialColor((*i).alProperties, aaiPositions[2], aaiTypes[2], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_AMBIENT);

      // handle phong power and shading mode
      int iMode = (int)aiShadingMode_Gouraud;
      if (0xFFFFFFFF != iPhong)   {
        ai_real fSpec = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), ePhong);

        // if shininess is 0 (and the pow() calculation would therefore always
        // become 1, not depending on the angle), use gouraud lighting
        if (fSpec)  {
          // scale this with 15 ... hopefully this is correct
          fSpec *= 15;
          pcHelper->AddProperty<ai_real>(&fSpec, 1, AI_MATKEY_SHININESS);

          iMode = (int)aiShadingMode_Phong;
        }
      }
      pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

      // handle opacity
      if (0xFFFFFFFF != iOpacity) {
        ai_real fOpacity = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), eOpacity);
        pcHelper->AddProperty<ai_real>(&fOpacity, 1, AI_MATKEY_OPACITY);
      }

      // The face order is absolutely undefined for PLY, so we have to
      // use two-sided rendering to be sure it's ok.
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);

      //default texture
      if (!defaultTexture.empty())
      {
        const aiString name(defaultTexture.c_str());
        pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
      }

      if (!pointsOnly)
      {
        const int two_sided = 1;
        pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
      }

      //set to wireframe, so when using this material info we can switch to points rendering
      if (pointsOnly)
      {
        const int wireframe = 1;
        pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
      }

      // add the newly created material instance to the list
      pvOut->push_back(pcHelper);
    }
  }
  else
  {
    // generate a default material
    aiMaterial* pcHelper = new aiMaterial();

    // fill in a default material
    int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    //generate white material most 3D engine just multiply ambient / diffuse color with actual ambient / light color
    aiColor3D clr;
    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_SPECULAR);

    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_AMBIENT);

    // The face order is absolutely undefined for PLY, so we have to
    // use two-sided rendering to be sure it's ok.
    if (!pointsOnly)
    {
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
    }

    //default texture
    if (!defaultTexture.empty())
    {
      const aiString name(defaultTexture.c_str());
      pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
    }

    //set to wireframe, so when using this material info we can switch to points rendering
    if (pointsOnly)
    {
      const int wireframe = 1;
      pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
    }

    pvOut->push_back(pcHelper);
  }
}